

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O1

void __thiscall SQClosure::Release(SQClosure *this)

{
  SQUnsignedInteger *pSVar1;
  SQFunctionProto *pSVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  pSVar2 = this->_function;
  lVar3 = pSVar2->_noutervalues;
  lVar4 = pSVar2->_ndefaultparams;
  if (0 < lVar3) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      SQObjectPtr::~SQObjectPtr
                ((SQObjectPtr *)((long)&(this->_outervalues->super_SQObject)._type + lVar6));
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar5 < pSVar2->_noutervalues);
  }
  if (0 < pSVar2->_ndefaultparams) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      SQObjectPtr::~SQObjectPtr
                ((SQObjectPtr *)((long)&(this->_defaultparams->super_SQObject)._type + lVar6));
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar5 < pSVar2->_ndefaultparams);
  }
  pSVar2 = this->_function;
  if (pSVar2 != (SQFunctionProto *)0x0) {
    pSVar1 = &(pSVar2->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar2->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
    }
    this->_function = (SQFunctionProto *)0x0;
  }
  (**(this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted)(this);
  sq_vm_free(this,(lVar4 + lVar3) * 0x10 + 0x60);
  return;
}

Assistant:

void Release(){
        SQFunctionProto *f = _function;
        SQInteger size = _CALC_CLOSURE_SIZE(f);
        _DESTRUCT_VECTOR(SQObjectPtr,f->_noutervalues,_outervalues);
        _DESTRUCT_VECTOR(SQObjectPtr,f->_ndefaultparams,_defaultparams);
        __ObjRelease(_function);
        this->~SQClosure();
        sq_vm_free(this,size);
    }